

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

BOOL Js::JavascriptNumber::GetThisValue(Var aValue,double *pDouble)

{
  Type TVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *pJVar7;
  JavascriptTypedNumber<unsigned_long> *pJVar8;
  JavascriptNumberObject *this_00;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cdaf64;
    *puVar6 = 0;
LAB_00cdadc5:
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00cdaf64;
      *puVar6 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if ((int)TVar1 < 2) {
        return 0;
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00cdaf64:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    if (TVar1 == TypeIds_LastNumberType) {
      pJVar8 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      *pDouble = ((double)CONCAT44(0x43300000,(int)pJVar8->m_value) - 4503599627370496.0) +
                 ((double)CONCAT44(0x45300000,(int)(pJVar8->m_value >> 0x20)) -
                 1.9342813113834067e+25);
      return 1;
    }
    if (TVar1 == TypeIds_Int64Number) {
      pJVar7 = VarTo<Js::JavascriptTypedNumber<long>>(aValue);
      dVar3 = (double)pJVar7->m_value;
      goto LAB_00cdaedf;
    }
    if (TVar1 != TypeIds_FirstNumberType) {
      if ((ulong)aValue >> 0x32 != 0) {
LAB_00cdaf33:
        *pDouble = (double)((ulong)aValue ^ 0xfffc000000000000);
        return 1;
      }
      if (TVar1 != TypeIds_NumberObject) {
        return 0;
      }
      this_00 = VarTo<Js::JavascriptNumberObject>(aValue);
      dVar3 = JavascriptNumberObject::GetValue(this_00);
      goto LAB_00cdaedf;
    }
  }
  else if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aValue >> 0x32 != 0) goto LAB_00cdaf33;
      goto LAB_00cdadc5;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00cdaf64;
    *puVar6 = 0;
  }
  dVar3 = (double)(int)aValue;
LAB_00cdaedf:
  *pDouble = dVar3;
  return 1;
}

Assistant:

BOOL JavascriptNumber::GetThisValue(Var aValue, double* pDouble)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId <= TypeIds_UndefinedOrNull)
        {
            return FALSE;
        }

        if (typeId == TypeIds_Integer)
        {
            *pDouble = TaggedInt::ToDouble(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_Int64Number)
        {
            *pDouble = (double)VarTo<JavascriptInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (typeId == TypeIds_UInt64Number)
        {
            *pDouble = (double)VarTo<JavascriptUInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aValue))
        {
            *pDouble = JavascriptNumber::GetValue(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_NumberObject)
        {
            JavascriptNumberObject* obj = VarTo<JavascriptNumberObject>(aValue);
            *pDouble = obj->GetValue();
            return TRUE;
        }
        else
        {
            return FALSE;
        }
    }